

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O2

AST_Function_Expression * parse_arglist(Translation_Data *translation_data,Scope *scope,AST *id)

{
  char cVar1;
  AST_Function_Expression *pAVar2;
  AST *data;
  
  pAVar2 = get_function_expression_tree(id,scope);
  pAVar2->id = id;
  cVar1 = get_and_check(translation_data,KW_CLOSE_NORMAL);
  if (cVar1 == '\0') {
    do {
      data = parse_assignment_expression(translation_data,scope);
      Queue_Push(&pAVar2->arguments,data);
      cVar1 = get_and_check(translation_data,KW_COMMA);
    } while (cVar1 != '\0');
    cVar1 = get_and_check(translation_data,KW_CLOSE_NORMAL);
    if (cVar1 == '\0') {
      push_translation_error("expected \')\' here",translation_data);
      pAVar2 = (AST_Function_Expression *)get_error_tree((AST *)pAVar2);
      return pAVar2;
    }
  }
  return pAVar2;
}

Assistant:

struct AST_Function_Expression* parse_arglist(struct Translation_Data *translation_data,struct Scope *scope,struct AST* id)
{
	struct AST_Function_Expression *ret;
	ret=get_function_expression_tree(id,scope);
	ret->id=id;
	if(get_and_check(translation_data,KW_CLOSE_NORMAL))
	{
		return ret;
	}
	do
	{
		Queue_Push(&ret->arguments,parse_assignment_expression(translation_data,scope));
	} while(get_and_check(translation_data,KW_COMMA));
	if(get_and_check(translation_data,KW_CLOSE_NORMAL))
	{
		return ret;
	}else
	{
		push_translation_error("expected ')' here",translation_data);
		return (struct AST_Function_Expression*)get_error_tree((struct AST*)ret);
	}

}